

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

hwaddr s390_cpu_get_phys_addr_debug(CPUState *cs,vaddr vaddr)

{
  _func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *p_Var1;
  hwaddr hVar2;
  MemTxAttrs local_c;
  
  local_c = (MemTxAttrs)0x0;
  p_Var1 = cs->cc->get_phys_page_attrs_debug;
  if (p_Var1 == (_func_hwaddr_CPUState_ptr_vaddr_MemTxAttrs_ptr_conflict *)0x0) {
    hVar2 = (*cs->cc->get_phys_page_debug)((CPUState_conflict *)cs,vaddr & 0xfffffffffffff000);
  }
  else {
    hVar2 = (*p_Var1)((CPUState_conflict *)cs,vaddr & 0xfffffffffffff000,&local_c);
  }
  return ((uint)vaddr & 0xfff) + hVar2;
}

Assistant:

hwaddr s390_cpu_get_phys_addr_debug(CPUState *cs, vaddr vaddr)
{
    hwaddr phys_addr;
    target_ulong page;

    page = vaddr & TARGET_PAGE_MASK;
    phys_addr = cpu_get_phys_page_debug(cs, page);
    phys_addr += (vaddr & ~TARGET_PAGE_MASK);

    return phys_addr;
}